

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O1

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,HasherHandle hasher,ZopfliNode *nodes)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  uint8_t *puVar28;
  ulong uVar29;
  ZopfliNode *nodes_00;
  BackwardMatch *local_19c0;
  ulong local_19b0;
  ulong local_19a8;
  ulong local_1960;
  ulong local_1950;
  uint32_t local_1908 [40];
  StartPosQueue queue;
  ZopfliCostModel model;
  BackwardMatch matches [384];
  
  uVar9 = 0x145;
  if (params->quality < 0xb) {
    uVar9 = 0x96;
  }
  lVar11 = 0;
  if (0x7e < num_bytes) {
    lVar11 = num_bytes - 0x7f;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,&model,&params->dist,num_bytes);
  ZopfliCostModelSetFromLiteralCosts(&model,position,ringbuffer,ringbuffer_mask);
  queue.idx_ = 0;
  if (3 < num_bytes) {
    sVar8 = 0;
    do {
      uVar4 = position + sVar8;
      sVar15 = max_backward_limit;
      if (uVar4 < max_backward_limit) {
        sVar15 = uVar4;
      }
      uVar21 = num_bytes - sVar8;
      uVar12 = uVar4 & ringbuffer_mask;
      uVar5 = 0x10;
      if (params->quality == 0xb) {
        uVar5 = 0x40;
      }
      uVar25 = 0;
      if (uVar5 <= uVar4) {
        uVar25 = uVar4 - uVar5;
      }
      puVar13 = ringbuffer + uVar12;
      uVar7 = (ulong)((uint)uVar21 & 7);
      uVar5 = 1;
      local_19c0 = matches;
      uVar23 = uVar4;
      do {
        uVar23 = uVar23 - 1;
        if ((uVar23 <= uVar25) || (2 < uVar5)) break;
        uVar16 = uVar4 - uVar23;
        if ((uVar16 <= sVar15) &&
           ((uVar26 = uVar23 & ringbuffer_mask, *puVar13 == ringbuffer[uVar26] &&
            (puVar13[1] == ringbuffer[uVar26 + 1])))) {
          if (7 < uVar21) {
            lVar27 = 0;
            uVar18 = 0;
LAB_00117ce0:
            if (*(ulong *)(puVar13 + uVar18 * 8) == *(ulong *)(ringbuffer + uVar18 * 8 + uVar26))
            goto code_r0x00117ced;
            uVar18 = *(ulong *)(ringbuffer + uVar18 * 8 + uVar26) ^ *(ulong *)(puVar13 + uVar18 * 8)
            ;
            uVar26 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar18 = (uVar26 >> 3 & 0x1fffffff) - lVar27;
            goto LAB_00117d18;
          }
          uVar14 = 0;
          puVar28 = puVar13;
LAB_00117d54:
          uVar18 = uVar14;
          if (uVar7 != 0) {
            uVar19 = uVar7 | uVar14;
            uVar20 = uVar7;
            do {
              uVar18 = uVar14;
              if (ringbuffer[uVar14 + uVar26] != *puVar28) break;
              puVar28 = puVar28 + 1;
              uVar14 = uVar14 + 1;
              uVar20 = uVar20 - 1;
              uVar18 = uVar19;
            } while (uVar20 != 0);
          }
LAB_00117d18:
          if (uVar5 < uVar18) {
            local_19c0->distance = (uint32_t)uVar16;
            local_19c0->length_and_code = (int)uVar18 << 5;
            local_19c0 = local_19c0 + 1;
            uVar5 = uVar18;
          }
        }
      } while (uVar16 <= sVar15);
      if (uVar5 < uVar21) {
        uVar23 = (ulong)((uint)(*(int *)(ringbuffer + uVar12) * 0x1e35a7bd) >> 0xf);
        uVar7 = (ulong)*(uint *)(hasher + uVar23 * 4 + 0x30);
        uVar25 = uVar21;
        if (0x7f < uVar21) {
          *(int *)(hasher + uVar23 * 4 + 0x30) = (int)uVar4;
          uVar25 = 0x80;
        }
        uVar23 = *(ulong *)(hasher + 0x28);
        lVar27 = (uVar23 & uVar4) * 2 + 1;
        lVar17 = (uVar23 & uVar4) * 2;
        lVar22 = 0x40;
        local_1950 = 0;
        local_1960 = 0;
LAB_00117e19:
        uVar16 = uVar4 - uVar7;
        if ((uVar16 != 0) && (lVar22 != 0 && uVar16 <= sVar15)) {
          uVar26 = local_1960;
          if (local_1950 < local_1960) {
            uVar26 = local_1950;
          }
          puVar13 = ringbuffer + uVar26 + (uVar7 & ringbuffer_mask);
          uVar18 = uVar21 - uVar26;
          if (7 < uVar18) {
            uVar20 = uVar18 & 0xfffffffffffffff8;
            lVar24 = 0;
            uVar14 = 0;
LAB_00117ebf:
            if (*(ulong *)(puVar13 + uVar14 * 8) ==
                *(ulong *)(ringbuffer + uVar14 * 8 + uVar26 + uVar12)) goto code_r0x00117ecc;
            uVar14 = *(ulong *)(ringbuffer + uVar14 * 8 + uVar26 + uVar12) ^
                     *(ulong *)(puVar13 + uVar14 * 8);
            uVar18 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar14 = (uVar18 >> 3 & 0x1fffffff) - lVar24;
            goto LAB_00117f1c;
          }
          uVar20 = 0;
          goto LAB_00118028;
        }
        if (0x7f < uVar21) {
          *(undefined4 *)(hasher + lVar17 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
          uVar2 = *(undefined4 *)(hasher + 0x80030);
          goto LAB_00117e50;
        }
        goto LAB_00117e57;
      }
LAB_0011806c:
      lVar27 = 0;
      do {
        local_1908[lVar27] = 0xfffffff;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x26);
      uVar5 = uVar5 + 1;
      if (uVar5 < 5) {
        uVar5 = 4;
      }
      nodes_00 = (ZopfliNode *)0x1180bb;
      iVar3 = BrotliFindAllStaticDictionaryMatches
                        (&params->dictionary,ringbuffer + uVar12,uVar5,uVar21,local_1908);
      if (iVar3 != 0) {
        if (0x24 < uVar21) {
          uVar21 = 0x25;
        }
        if (uVar5 <= uVar21) {
          iVar3 = (int)uVar5 << 5;
          do {
            uVar10 = local_1908[uVar5];
            if ((uVar10 < 0xfffffff) &&
               (uVar12 = (ulong)(uVar10 >> 5) + sVar15 + 1, uVar12 <= (params->dist).max_distance))
            {
              uVar10 = uVar10 & 0x1f;
              local_19c0->distance = (uint32_t)uVar12;
              if (uVar5 == uVar10) {
                uVar10 = 0;
              }
              local_19c0->length_and_code = uVar10 + iVar3;
              local_19c0 = local_19c0 + 1;
            }
            uVar5 = uVar5 + 1;
            iVar3 = iVar3 + 0x20;
          } while (uVar21 + 1 != uVar5);
        }
      }
      if ((long)local_19c0 - (long)matches == 0) {
        sVar15 = 0;
      }
      else {
        sVar15 = (long)local_19c0 - (long)matches >> 3;
        if (uVar9 < local_19c0[-1].length_and_code >> 5) {
          matches[0] = matches[sVar15 - 1];
          sVar15 = 1;
        }
      }
      sVar6 = UpdateNodes(num_bytes,position,sVar8,ringbuffer,ringbuffer_mask,params,
                          max_backward_limit,dist_cache,sVar15,matches,&model,&queue,nodes);
      uVar5 = 0;
      if (0x3fff < sVar6) {
        uVar5 = sVar6;
      }
      if (sVar15 == 1) {
        uVar10 = matches[0].length_and_code >> 5;
        if ((uVar9 < uVar10) && (uVar5 < uVar10)) {
          uVar5 = (ulong)uVar10;
        }
      }
      sVar15 = sVar8;
      if (1 < uVar5) {
        uVar12 = uVar4 + 1;
        uVar21 = uVar5 + uVar4;
        if (lVar11 + position <= uVar5 + uVar4) {
          uVar21 = lVar11 + position;
        }
        uVar25 = uVar21 - 0x3f;
        if (uVar21 < uVar4 + 0x40) {
          uVar25 = uVar12;
        }
        if ((uVar4 + 0x201 <= uVar25) && (uVar12 < uVar25)) {
          uVar4 = *(ulong *)(hasher + 0x28);
LAB_0011827a:
          uVar16 = uVar12 & ringbuffer_mask;
          uVar26 = (ulong)((uint)(*(int *)(ringbuffer + uVar16) * 0x1e35a7bd) >> 0xf);
          uVar18 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x30);
          uVar23 = (uVar4 & uVar12) * 2 + 1;
          uVar7 = (uVar4 & uVar12) * 2;
          *(int *)(hasher + uVar26 * 4 + 0x30) = (int)uVar12;
          lVar27 = 0x40;
          local_19a8 = 0;
          local_19b0 = 0;
LAB_001182c9:
          if ((uVar12 != uVar18) && (lVar27 != 0 && uVar12 - uVar18 <= uVar4 - 0xf)) {
            uVar26 = local_19b0;
            if (local_19a8 < local_19b0) {
              uVar26 = local_19a8;
            }
            puVar13 = ringbuffer + uVar26 + (uVar18 & ringbuffer_mask);
            uVar14 = 0x80 - uVar26;
            if (7 < uVar14) {
              uVar19 = uVar14 & 0xfffffffffffffff8;
              lVar17 = 0;
              uVar20 = 0;
LAB_00118365:
              if (*(ulong *)(puVar13 + uVar20 * 8) ==
                  *(ulong *)(ringbuffer + uVar20 * 8 + uVar26 + uVar16)) goto code_r0x00118372;
              uVar20 = *(ulong *)(ringbuffer + uVar20 * 8 + uVar26 + uVar16) ^
                       *(ulong *)(puVar13 + uVar20 * 8);
              uVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar20 = (uVar14 >> 3 & 0x1fffffff) - lVar17;
              goto LAB_001183c4;
            }
            uVar19 = 0;
            goto LAB_00118458;
          }
          *(undefined4 *)(hasher + uVar7 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
          *(undefined4 *)(hasher + uVar23 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
          bVar1 = false;
          goto LAB_00118448;
        }
LAB_0011849a:
        if (uVar25 < uVar21) {
          uVar4 = *(ulong *)(hasher + 0x28);
LAB_001184b2:
          uVar7 = uVar25 & ringbuffer_mask;
          uVar26 = (ulong)((uint)(*(int *)(ringbuffer + uVar7) * 0x1e35a7bd) >> 0xf);
          uVar16 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x30);
          uVar12 = (uVar4 & uVar25) * 2 + 1;
          uVar23 = (uVar4 & uVar25) * 2;
          *(int *)(hasher + uVar26 * 4 + 0x30) = (int)uVar25;
          lVar27 = 0x40;
          local_19a8 = 0;
          local_19b0 = 0;
LAB_00118502:
          if ((uVar25 != uVar16) && (lVar27 != 0 && uVar25 - uVar16 <= uVar4 - 0xf)) {
            uVar26 = local_19b0;
            if (local_19a8 < local_19b0) {
              uVar26 = local_19a8;
            }
            puVar13 = ringbuffer + uVar26 + (uVar16 & ringbuffer_mask);
            uVar18 = 0x80 - uVar26;
            if (7 < uVar18) {
              uVar20 = uVar18 & 0xfffffffffffffff8;
              lVar17 = 0;
              uVar14 = 0;
LAB_001185a4:
              if (*(ulong *)(puVar13 + uVar14 * 8) ==
                  *(ulong *)(ringbuffer + uVar14 * 8 + uVar26 + uVar7)) goto code_r0x001185b2;
              uVar14 = *(ulong *)(ringbuffer + uVar14 * 8 + uVar26 + uVar7) ^
                       *(ulong *)(puVar13 + uVar14 * 8);
              uVar18 = 0;
              if (uVar14 != 0) {
                for (; (uVar14 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                }
              }
              uVar14 = (uVar18 >> 3 & 0x1fffffff) - lVar17;
              goto LAB_001185fe;
            }
            uVar20 = 0;
            goto LAB_00118686;
          }
          *(undefined4 *)(hasher + uVar23 * 4 + 0x80038) = *(undefined4 *)(hasher + 0x80030);
          uVar2 = *(undefined4 *)(hasher + 0x80030);
          goto LAB_00118531;
        }
LAB_001186c4:
        lVar27 = uVar5 - 1;
        if (lVar27 != 0) {
          uVar4 = sVar8 + 4;
          do {
            sVar15 = uVar4 - 3;
            if (num_bytes <= uVar4) break;
            EvaluateNode(position,sVar15,max_backward_limit,(size_t)dist_cache,(int *)&model,
                         (ZopfliCostModel *)&queue,(StartPosQueue *)nodes,nodes_00);
            uVar4 = uVar4 + 1;
            lVar27 = lVar27 + -1;
          } while (lVar27 != 0);
        }
      }
      sVar8 = sVar15 + 1;
    } while (sVar15 + 4 < num_bytes);
  }
  BrotliFree(m,model.literal_costs_);
  model.literal_costs_ = (float *)0x0;
  BrotliFree(m,model.cost_dist_);
  model.cost_dist_ = (float *)0x0;
  sVar8 = ComputeShortestPathFromNodes(num_bytes,nodes);
  return sVar8;
code_r0x00117ced:
  uVar18 = uVar18 + 1;
  lVar27 = lVar27 + -8;
  uVar14 = uVar21 & 0xfffffffffffffff8;
  puVar28 = puVar13 + (uVar21 & 0xfffffffffffffff8);
  if (uVar21 >> 3 == uVar18) goto LAB_00117d54;
  goto LAB_00117ce0;
code_r0x00117ecc:
  uVar14 = uVar14 + 1;
  lVar24 = lVar24 + -8;
  if (uVar18 >> 3 == uVar14) goto code_r0x00117ed8;
  goto LAB_00117ebf;
code_r0x00117ed8:
  puVar13 = puVar13 + -lVar24;
LAB_00118028:
  uVar18 = uVar18 & 7;
  uVar14 = uVar20;
  if (uVar18 != 0) {
    uVar19 = uVar20 | uVar18;
    do {
      uVar14 = uVar20;
      if (ringbuffer[uVar20 + uVar26 + uVar12] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar20 = uVar20 + 1;
      uVar18 = uVar18 - 1;
      uVar14 = uVar19;
    } while (uVar18 != 0);
  }
LAB_00117f1c:
  uVar14 = uVar14 + uVar26;
  if (local_19c0 == (BackwardMatch *)0x0) {
    local_19c0 = (BackwardMatch *)0x0;
  }
  else if (uVar5 < uVar14) {
    local_19c0->distance = (uint32_t)uVar16;
    local_19c0->length_and_code = (int)uVar14 << 5;
    local_19c0 = local_19c0 + 1;
    uVar5 = uVar14;
  }
  if (uVar14 < uVar25) {
    if (ringbuffer[uVar14 + (uVar7 & ringbuffer_mask)] < ringbuffer[uVar14 + uVar12]) {
      if (0x7f < uVar21) {
        *(int *)(hasher + lVar17 * 4 + 0x80038) = (int)uVar7;
      }
      lVar17 = (uVar7 & uVar23) * 2 + 1;
      lVar24 = lVar17;
      local_1950 = uVar14;
    }
    else {
      if (0x7f < uVar21) {
        *(int *)(hasher + lVar27 * 4 + 0x80038) = (int)uVar7;
      }
      lVar27 = (uVar7 & uVar23) * 2;
      lVar24 = lVar27;
      local_1960 = uVar14;
    }
    uVar7 = (ulong)*(uint *)(hasher + lVar24 * 4 + 0x80038);
    bVar1 = true;
  }
  else if (uVar21 < 0x80) {
    bVar1 = false;
  }
  else {
    *(undefined4 *)(hasher + lVar17 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar7 & uVar23) * 8 + 0x80038);
    uVar2 = *(undefined4 *)(hasher + (uVar7 & uVar23) * 8 + 0x8003c);
LAB_00117e50:
    *(undefined4 *)(hasher + lVar27 * 4 + 0x80038) = uVar2;
LAB_00117e57:
    bVar1 = false;
  }
  lVar22 = lVar22 + -1;
  if (!bVar1) goto LAB_0011806c;
  goto LAB_00117e19;
code_r0x00118372:
  uVar20 = uVar20 + 1;
  lVar17 = lVar17 + -8;
  if (uVar14 >> 3 == uVar20) goto code_r0x0011837e;
  goto LAB_00118365;
code_r0x0011837e:
  puVar13 = puVar13 + -lVar17;
LAB_00118458:
  uVar14 = uVar14 & 7;
  uVar20 = uVar19;
  if (uVar14 != 0) {
    uVar29 = uVar19 | uVar14;
    do {
      uVar20 = uVar19;
      if (ringbuffer[uVar19 + uVar26 + uVar16] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar19 = uVar19 + 1;
      uVar14 = uVar14 - 1;
      uVar20 = uVar29;
    } while (uVar14 != 0);
  }
LAB_001183c4:
  uVar20 = uVar20 + uVar26;
  if (uVar20 < 0x80) {
    uVar26 = (uVar18 & uVar4) * 2;
    if (ringbuffer[uVar20 + (uVar18 & ringbuffer_mask)] < ringbuffer[uVar20 + uVar16]) {
      *(int *)(hasher + uVar7 * 4 + 0x80038) = (int)uVar18;
      uVar26 = uVar26 | 1;
      uVar7 = uVar26;
      local_19a8 = uVar20;
    }
    else {
      *(int *)(hasher + uVar23 * 4 + 0x80038) = (int)uVar18;
      uVar23 = uVar26;
      local_19b0 = uVar20;
    }
    uVar18 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x80038);
    bVar1 = true;
  }
  else {
    *(undefined4 *)(hasher + uVar7 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar18 & uVar4) * 8 + 0x80038);
    *(undefined4 *)(hasher + uVar23 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar18 & uVar4) * 8 + 0x8003c);
    bVar1 = false;
  }
LAB_00118448:
  lVar27 = lVar27 + -1;
  if (!bVar1) goto LAB_00118488;
  goto LAB_001182c9;
LAB_00118488:
  uVar12 = uVar12 + 8;
  if (uVar25 <= uVar12) goto LAB_0011849a;
  goto LAB_0011827a;
code_r0x001185b2:
  uVar14 = uVar14 + 1;
  lVar17 = lVar17 + -8;
  if (uVar18 >> 3 == uVar14) goto code_r0x001185be;
  goto LAB_001185a4;
code_r0x001185be:
  puVar13 = puVar13 + -lVar17;
LAB_00118686:
  uVar18 = uVar18 & 7;
  uVar14 = uVar20;
  if (uVar18 != 0) {
    uVar19 = uVar20 | uVar18;
    do {
      uVar14 = uVar20;
      if (ringbuffer[uVar20 + uVar26 + uVar7] != *puVar13) break;
      puVar13 = puVar13 + 1;
      uVar20 = uVar20 + 1;
      uVar18 = uVar18 - 1;
      uVar14 = uVar19;
    } while (uVar18 != 0);
  }
LAB_001185fe:
  uVar14 = uVar14 + uVar26;
  if (uVar14 < 0x80) {
    uVar26 = (uVar16 & uVar4) * 2;
    if (ringbuffer[uVar14 + (uVar16 & ringbuffer_mask)] < ringbuffer[uVar14 + uVar7]) {
      *(int *)(hasher + uVar23 * 4 + 0x80038) = (int)uVar16;
      uVar26 = uVar26 | 1;
      uVar23 = uVar26;
      local_19a8 = uVar14;
    }
    else {
      *(int *)(hasher + uVar12 * 4 + 0x80038) = (int)uVar16;
      uVar12 = uVar26;
      local_19b0 = uVar14;
    }
    uVar16 = (ulong)*(uint *)(hasher + uVar26 * 4 + 0x80038);
    bVar1 = true;
  }
  else {
    *(undefined4 *)(hasher + uVar23 * 4 + 0x80038) =
         *(undefined4 *)(hasher + (uVar16 & uVar4) * 8 + 0x80038);
    uVar2 = *(undefined4 *)(hasher + (uVar16 & uVar4) * 8 + 0x8003c);
LAB_00118531:
    *(undefined4 *)(hasher + uVar12 * 4 + 0x80038) = uVar2;
    bVar1 = false;
  }
  lVar27 = lVar27 + -1;
  if (!bVar1) goto LAB_001186b6;
  goto LAB_00118502;
LAB_001186b6:
  uVar25 = uVar25 + 1;
  if (uVar21 <= uVar25) goto LAB_001186c4;
  goto LAB_001184b2;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
    size_t num_bytes, size_t position, const uint8_t* ringbuffer,
    size_t ringbuffer_mask, const BrotliEncoderParams* params,
    const size_t max_backward_limit, const int* dist_cache, HasherHandle hasher,
    ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[2 * (MAX_NUM_MATCHES_H10 + 64)];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  size_t gap = 0;
  size_t lz_matches_offset = 0;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, &params->dist, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t skip;
    size_t num_matches = FindAllMatchesH10(hasher, &params->dictionary,
        ringbuffer, ringbuffer_mask, pos, num_bytes - i, max_distance, gap,
        params, &matches[lz_matches_offset]);
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(position, i, max_backward_limit, gap, dist_cache, &model,
            &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}